

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_rng.c
# Opt level: O0

err_t cmdRngKbRead(tm_ticks_t *data)

{
  bool_t bVar1;
  int iVar2;
  tm_ticks_t tVar3;
  tm_ticks_t tVar4;
  ulong uVar5;
  long in_RDI;
  int c;
  int ch;
  bool_t echo;
  size_t pos;
  err_t code;
  tm_ticks_t t;
  tm_ticks_t ticks;
  tm_ticks_t min_delay;
  tm_ticks_t max_delay;
  tm_ticks_t freq;
  int local_50;
  ulong local_48;
  err_t local_3c;
  tm_ticks_t local_30;
  bool_t on;
  err_t local_4;
  
  tVar3 = tmFreq();
  local_3c = 0xca;
  if (19999999 < tVar3) {
    local_3c = 0;
  }
  local_4 = local_3c;
  if (local_3c == 0) {
    printf("Collecting entropy from keyboard...\n");
    printf("Please, press different keys avoiding repetitions and long pauses:\n");
    for (local_48 = 0x80; local_48 != 0; local_48 = local_48 - 2) {
      printf("%c",0x2a);
    }
    printf("\r");
    on = (bool_t)(tVar3 * 5 >> 0x20);
    cmdTermEcho(on);
    local_30 = tmTicks();
    local_50 = 0;
    while (local_48 < 0x80) {
      tVar4 = tmTicks();
      if (local_30 + tVar3 * 5 < tVar4) {
        local_3c = 0x75;
        break;
      }
      bVar1 = cmdTermKbhit();
      if ((((bVar1 != 0) && (local_30 + tVar3 / 0x14 <= tVar4)) &&
          (iVar2 = cmdTermGetch(), iVar2 != local_50)) && ((iVar2 != 0 && (iVar2 != 0xe0)))) {
        uVar5 = local_48 + 1;
        *(tm_ticks_t *)(in_RDI + local_48 * 8) = tVar4 - local_30;
        local_50 = iVar2;
        local_48 = uVar5;
        local_30 = tVar4;
        if ((uVar5 & 1) != 0) {
          printf(".");
        }
      }
    }
    cmdTermEcho(on);
    printf("\n");
    local_4 = local_3c;
  }
  return local_4;
}

Assistant:

err_t cmdRngKbRead(tm_ticks_t data[128])
{
	const tm_ticks_t freq = tmFreq(); /* число обновлений таймера в секунду */
	const tm_ticks_t max_delay = freq * 5; /* 5 с */
	const tm_ticks_t min_delay = freq / 20; /* 50 мс */
	register tm_ticks_t ticks;
	register tm_ticks_t t;
	err_t code;
	size_t pos;
	bool_t echo;
	int ch;
	// pre
	ASSERT(memIsValid(data, sizeof(tm_ticks_t) * 128));
	// таймер достаточно точен?
	code = freq >= 20000000u ? ERR_OK : ERR_FILE_NOT_FOUND;
	ERR_CALL_CHECK(code);
	// приглашение к сбору энтропии
	printf("Collecting entropy from keyboard...\n");
	printf("Please, press different keys avoiding repetitions and long pauses:\n");
	for (pos = 128; pos; pos -= 2)
		printf("%c", '*');
	printf("\r");
	// сбор энтропии
	echo = cmdTermEcho(FALSE);
	ASSERT(pos == 0);
	for (ticks = tmTicks(), ch = 0; pos < 128; )
	{
		int c;
		// превышен интервал ожидания?
		t = tmTicks();
		if (t > ticks + max_delay)
		{
			code = ERR_TIMEOUT;
			break;
		}
		// клавиша не нажата? нажата слишком быcтро?
		// нажали ту же клавишу? функциональную клавишу?
		if (!cmdTermKbhit() || t < ticks + min_delay ||
			(c = cmdTermGetch()) == ch || c == 0 || c == 0xE0)
			continue;
		// обрабатать нажатие
		data[pos++] = t - ticks, ticks = t, ch = c;
		if (pos % 2)
			printf(".");
	}
	ticks = t = 0;
	cmdTermEcho(echo);
	printf("\n");
	return code;
}